

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

CandidateVector *
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_candidates_for_feature
          (CandidateVector *__return_storage_ptr__,Feature feature)

{
  Candidate *arg_list_end;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 local_18;
  Candidate CStack_10;
  Candidate CStack_c;
  
  arg_list_end = (Candidate *)&stack0xfffffffffffffff8;
  switch(feature) {
  case SubgroupMask:
  case SubgroupBallot:
    local_18 = 0x500000000;
    break;
  case SubgroupSize:
    uVar1 = 1;
    uVar2 = 5;
    CStack_10 = AMD_gcn_shader;
    CStack_c = ARB_shader_ballot;
    goto LAB_002b6187;
  case SubgroupInvocationID:
    local_18 = 0x500000001;
    break;
  case SubgroupID:
  case NumSubgroups:
    local_18 = 0x500000001;
    goto LAB_002b60df;
  case SubgroupBroadcast_First:
    local_18 = 0x600000000;
    break;
  case SubgroupBallotFindLSB_MSB:
    local_18 = 0x500000000;
    goto LAB_002b60df;
  case SubgroupAll_Any_AllEqualBool:
    uVar1 = 2;
    uVar2 = 4;
    CStack_10 = ARB_shader_group_vote;
    CStack_c = AMD_gcn_shader;
    goto LAB_002b6187;
  default:
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).buffer_size
         = 0;
    (__return_storage_ptr__->
    super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>).ptr =
         (Candidate *)&__return_storage_ptr__->stack_storage;
    __return_storage_ptr__->buffer_capacity = 10;
    return __return_storage_ptr__;
  case SubgroupBarrier:
    uVar1 = 1;
    uVar2 = 5;
    CStack_10 = ARB_shader_ballot;
    CStack_c = AMD_gcn_shader;
LAB_002b6187:
    local_18 = CONCAT44(uVar2,uVar1);
    goto LAB_002b6190;
  case SubgroupMemBarrier:
    arg_list_end = (Candidate *)((long)&local_18 + 4);
    local_18 = CONCAT44(local_18._4_4_,1);
    goto LAB_002b6190;
  case SubgroupBallotBitExtract:
    arg_list_end = (Candidate *)((long)&local_18 + 4);
    local_18 = CONCAT44(local_18._4_4_,5);
    goto LAB_002b6190;
  case SubgroupArithmeticIAddReduce:
  case SubgroupArithmeticIAddExclusiveScan:
  case SubgroupArithmeticIAddInclusiveScan:
  case SubgroupArithmeticFAddReduce:
  case SubgroupArithmeticFAddExclusiveScan:
  case SubgroupArithmeticFAddInclusiveScan:
  case SubgroupArithmeticIMulReduce:
  case SubgroupArithmeticIMulExclusiveScan:
  case SubgroupArithmeticIMulInclusiveScan:
  case SubgroupArithmeticFMulReduce:
  case SubgroupArithmeticFMulExclusiveScan:
  case SubgroupArithmeticFMulInclusiveScan:
    local_18 = 0x600000003;
LAB_002b60df:
    arg_list_end = &CStack_10;
    goto LAB_002b6190;
  }
  arg_list_end = &CStack_c;
  CStack_10 = ARB_shader_ballot;
LAB_002b6190:
  SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate,_10UL>::
  SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Candidate>
            (__return_storage_ptr__,(Candidate *)&local_18,arg_list_end);
  return __return_storage_ptr__;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::CandidateVector CompilerGLSL::ShaderSubgroupSupportHelper::
    get_candidates_for_feature(Feature feature)
{
	switch (feature)
	{
	case SubgroupMask:
		return { KHR_shader_subgroup_ballot, NV_shader_thread_group, ARB_shader_ballot };
	case SubgroupSize:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group, AMD_gcn_shader, ARB_shader_ballot };
	case SubgroupInvocationID:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group, ARB_shader_ballot };
	case SubgroupID:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group };
	case NumSubgroups:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group };
	case SubgroupBroadcast_First:
		return { KHR_shader_subgroup_ballot, NV_shader_thread_shuffle, ARB_shader_ballot };
	case SubgroupBallotFindLSB_MSB:
		return { KHR_shader_subgroup_ballot, NV_shader_thread_group };
	case SubgroupAll_Any_AllEqualBool:
		return { KHR_shader_subgroup_vote, NV_gpu_shader_5, ARB_shader_group_vote, AMD_gcn_shader };
	case SubgroupAllEqualT:
		return {}; // depends on other features only
	case SubgroupElect:
		return {}; // depends on other features only
	case SubgroupBallot:
		return { KHR_shader_subgroup_ballot, NV_shader_thread_group, ARB_shader_ballot };
	case SubgroupBarrier:
		return { KHR_shader_subgroup_basic, NV_shader_thread_group, ARB_shader_ballot, AMD_gcn_shader };
	case SubgroupMemBarrier:
		return { KHR_shader_subgroup_basic };
	case SubgroupInverseBallot_InclBitCount_ExclBitCout:
		return {};
	case SubgroupBallotBitExtract:
		return { NV_shader_thread_group };
	case SubgroupBallotBitCount:
		return {};
	case SubgroupArithmeticIAddReduce:
	case SubgroupArithmeticIAddExclusiveScan:
	case SubgroupArithmeticIAddInclusiveScan:
	case SubgroupArithmeticFAddReduce:
	case SubgroupArithmeticFAddExclusiveScan:
	case SubgroupArithmeticFAddInclusiveScan:
	case SubgroupArithmeticIMulReduce:
	case SubgroupArithmeticIMulExclusiveScan:
	case SubgroupArithmeticIMulInclusiveScan:
	case SubgroupArithmeticFMulReduce:
	case SubgroupArithmeticFMulExclusiveScan:
	case SubgroupArithmeticFMulInclusiveScan:
		return { KHR_shader_subgroup_arithmetic, NV_shader_thread_shuffle };
	default:
		return {};
	}
}